

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-gvec-desc.h
# Opt level: O2

void helper_gvec_umax32_mipsel(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  uint uVar2;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + 4) {
    uVar2 = *(uint *)((long)b + uVar1);
    if (*(uint *)((long)b + uVar1) < *(uint *)((long)a + uVar1)) {
      uVar2 = *(uint *)((long)a + uVar1);
    }
    *(uint *)((long)d + uVar1) = uVar2;
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

static inline intptr_t simd_oprsz(uint32_t desc)
{
    return (extract32(desc, SIMD_OPRSZ_SHIFT, SIMD_OPRSZ_BITS) + 1) * 8;
}